

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidgetPrivate::embedSubWindow(QGraphicsProxyWidgetPrivate *this,QWidget *subWin)

{
  long lVar1;
  QGraphicsItem *pQVar2;
  QGraphicsProxyWidget *this_00;
  QGraphicsItem *pQVar3;
  
  lVar1 = *(long *)(*(long *)&subWin->field_0x8 + 0x78);
  if ((lVar1 != 0) && (*(long *)(lVar1 + 0x10) != 0)) {
    return;
  }
  this_00 = (QGraphicsProxyWidget *)operator_new(0x30);
  pQVar2 = (this->super_QGraphicsWidgetPrivate).super_QGraphicsItemPrivate.q_ptr;
  pQVar3 = pQVar2 + -1;
  if (pQVar2 == (QGraphicsItem *)0x0) {
    pQVar3 = (QGraphicsItem *)0x0;
  }
  pQVar3 = pQVar3 + 1;
  if (pQVar2 == (QGraphicsItem *)0x0) {
    pQVar3 = (QGraphicsItem *)0x0;
  }
  QGraphicsProxyWidget::QGraphicsProxyWidget
            (this_00,pQVar3,
             (WindowFlags)
             (subWin->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i);
  setWidget_helper(*(QGraphicsProxyWidgetPrivate **)(this_00 + 0x18),subWin,false);
  return;
}

Assistant:

void QGraphicsProxyWidgetPrivate::embedSubWindow(QWidget *subWin)
{
    const auto &extra = subWin->d_func()->extra;
    if (!extra || !extra->proxyWidget) {
        QGraphicsProxyWidget *subProxy = new QGraphicsProxyWidget(q_func(), subWin->windowFlags());
        subProxy->d_func()->setWidget_helper(subWin, false);
    }
}